

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void DockNodeFindInfo(ImGuiDockNode *node,ImGuiDockNodeTreeInfo *info)

{
  do {
    if (0 < (node->Windows).Size) {
      if (info->FirstNodeWithWindows == (ImGuiDockNode *)0x0) {
        info->FirstNodeWithWindows = node;
      }
      info->CountNodesWithWindows = info->CountNodesWithWindows + 1;
    }
    if ((node->MergedFlags & 0x800) != 0) {
      if (info->CentralNode != (ImGuiDockNode *)0x0) {
        __assert_fail("info->CentralNode == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x35a8,"void DockNodeFindInfo(ImGuiDockNode *, ImGuiDockNodeTreeInfo *)");
      }
      if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
        __assert_fail("node->IsLeafNode() && \"If you get this assert: please submit .ini file + repro of actions leading to this.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x35a9,"void DockNodeFindInfo(ImGuiDockNode *, ImGuiDockNodeTreeInfo *)");
      }
      info->CentralNode = node;
    }
    if ((1 < info->CountNodesWithWindows) && (info->CentralNode != (ImGuiDockNode *)0x0)) {
      return;
    }
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeFindInfo(node->ChildNodes[0],info);
    }
    node = node->ChildNodes[1];
  } while (node != (ImGuiDockNode *)0x0);
  return;
}

Assistant:

static void DockNodeFindInfo(ImGuiDockNode* node, ImGuiDockNodeTreeInfo* info)
{
    if (node->Windows.Size > 0)
    {
        if (info->FirstNodeWithWindows == NULL)
            info->FirstNodeWithWindows = node;
        info->CountNodesWithWindows++;
    }
    if (node->IsCentralNode())
    {
        IM_ASSERT(info->CentralNode == NULL); // Should be only one
        IM_ASSERT(node->IsLeafNode() && "If you get this assert: please submit .ini file + repro of actions leading to this.");
        info->CentralNode = node;
    }
    if (info->CountNodesWithWindows > 1 && info->CentralNode != NULL)
        return;
    if (node->ChildNodes[0])
        DockNodeFindInfo(node->ChildNodes[0], info);
    if (node->ChildNodes[1])
        DockNodeFindInfo(node->ChildNodes[1], info);
}